

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestInterfaceDynamicImpl::call
          (TestInterfaceDynamicImpl *this,Method method,
          CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> context)

{
  Reader reader;
  PointerReader reader_00;
  PointerReader reader_01;
  PointerBuilder builder;
  StructSchema schema;
  CallContextHook *pCVar1;
  ReaderFor<bool> RVar2;
  int32_t iVar3;
  short *psVar4;
  long in_RSI;
  bool bVar5;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar6;
  Promise<void> PVar7;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Reader params;
  Fault f;
  ArrayPtr<const_char> local_260;
  Runnable local_250;
  SegmentBuilder *local_248;
  undefined1 in_stack_fffffffffffffdc0 [16];
  undefined1 in_stack_fffffffffffffdd0 [16];
  Schema in_stack_fffffffffffffde0;
  SegmentReader *pSStack_218;
  CapTableReader *local_210;
  void *pvStack_208;
  WirePointer *local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  Reader local_1e8;
  uint local_1b0 [6];
  Maybe<kj::Exception> local_198;
  
  bVar5 = method.proto._reader.pointerCount == 0;
  local_198.ptr.field_1.value.ownFile.content.size_ = (size_t)method.proto._reader.pointers;
  if (bVar5) {
    local_198.ptr.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
  }
  local_198.ptr.field_1._16_4_ = 0x7fffffff;
  if (!bVar5) {
    local_198.ptr.field_1._16_4_ = method.proto._reader.nestingLimit;
  }
  local_198.ptr._0_4_ = UNKNOWN;
  local_198.ptr._4_4_ = 0;
  local_198.ptr.field_1._0_4_ = 0;
  local_198.ptr.field_1._4_4_ = 0;
  if (!bVar5) {
    local_198.ptr._0_4_ = (Type)method.proto._reader.segment;
    local_198.ptr._4_4_ = method.proto._reader.segment._4_4_;
    local_198.ptr.field_1._0_4_ = method.proto._reader.capTable._0_4_;
    local_198.ptr.field_1._4_4_ = method.proto._reader.capTable._4_4_;
  }
  local_260 = (ArrayPtr<const_char>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)&local_198,(void *)0x0,0);
  pCVar1 = context.hook;
  psVar4 = (short *)local_260.ptr;
  if (local_260.size_ == 4) {
    if ((char)psVar4[1] == 'o' && *psVar4 == 0x6f66) {
      **(int **)(in_RSI + 0x18) = **(int **)(in_RSI + 0x18) + 1;
      (**(context.hook)->_vptr_CallContextHook)(&local_198,context.hook);
      reader_00.pointer = (WirePointer *)in_stack_fffffffffffffdd0._0_8_;
      reader_00.nestingLimit = in_stack_fffffffffffffdd0._8_4_;
      reader_00._28_4_ = in_stack_fffffffffffffdd0._12_4_;
      reader_00.segment = (SegmentReader *)in_stack_fffffffffffffdc0._0_8_;
      reader_00.capTable = (CapTableReader *)in_stack_fffffffffffffdc0._8_8_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (reader_00,(StructSchema)local_198.ptr.field_1.value.ownFile.content.ptr);
      name.content.size_ = 2;
      name.content.ptr = "i";
      DynamicStruct::Reader::get((Reader *)&local_198,&local_1e8,name);
      iVar3 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&local_198);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
      if ((iVar3 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
        local_250._vptr_Runnable._0_4_ = 0x7b;
        name_00.content.size_ = 2;
        name_00.content.ptr = "i";
        DynamicStruct::Reader::get((Reader *)&local_198,&local_1e8,name_00);
        local_1b0[0] = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_198);
        kj::_::Debug::log<char_const(&)[54],int,int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,400,ERROR,
                   "\"failed: expected \" \"(123) == (params.get(\\\"i\\\").as<int>())\", 123, params.get(\"i\").as<int>()"
                   ,(char (*) [54])"failed: expected (123) == (params.get(\"i\").as<int>())",
                   (int *)&local_250,(int *)local_1b0);
        DynamicValue::Reader::~Reader((Reader *)&local_198);
      }
      name_01.content.size_ = 2;
      name_01.content.ptr = "j";
      DynamicStruct::Reader::get((Reader *)&local_198,&local_1e8,name_01);
      RVar2 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&local_198);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
      if (!RVar2 && kj::_::Debug::minSeverity < 3) {
        kj::_::Debug::log<char_const(&)[44]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x191,ERROR,"\"failed: expected \" \"params.get(\\\"j\\\").as<bool>()\"",
                   (char (*) [44])"failed: expected params.get(\"j\").as<bool>()");
      }
      local_1b0[0] = local_1b0[0] & 0xffffff00;
      (*pCVar1->_vptr_CallContextHook[2])(&local_198,pCVar1);
      schema.super_Schema.raw._4_4_ = local_198.ptr._4_4_;
      schema.super_Schema.raw._0_1_ = local_198.ptr.isSet;
      schema.super_Schema.raw._1_3_ = local_198.ptr._1_3_;
      builder.pointer = (WirePointer *)in_stack_fffffffffffffde0.raw;
      builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdd0._0_8_;
      builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdd0._8_8_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic(builder,schema);
      local_198.ptr._0_4_ = TEXT;
      local_198.ptr.field_1.value.ownFile.content.ptr = "foo";
      local_198.ptr.field_1.value.ownFile.content.size_ = 4;
      name_03.content.size_ = 2;
      name_03.content.ptr = "x";
      DynamicStruct::Builder::set((Builder *)&local_250,name_03,(Reader *)&local_198);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
      goto LAB_00283353;
    }
    if ((char)psVar4[1] == 'z' && *psVar4 == 0x6162) {
      **(int **)(in_RSI + 0x18) = **(int **)(in_RSI + 0x18) + 1;
      (**(context.hook)->_vptr_CallContextHook)(&local_198,context.hook);
      reader_01.pointer = (WirePointer *)in_stack_fffffffffffffdd0._0_8_;
      reader_01.nestingLimit = in_stack_fffffffffffffdd0._8_4_;
      reader_01._28_4_ = in_stack_fffffffffffffdd0._12_4_;
      reader_01.segment = (SegmentReader *)in_stack_fffffffffffffdc0._0_8_;
      reader_01.capTable = (CapTableReader *)in_stack_fffffffffffffdc0._8_8_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (reader_01,(StructSchema)local_198.ptr.field_1.value.ownFile.content.ptr);
      name_02.content.size_ = 2;
      name_02.content.ptr = "s";
      DynamicStruct::Reader::get((Reader *)&local_198,&local_1e8,name_02);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&stack0xfffffffffffffde0,(Reader *)&local_198);
      reader.reader.segment = pSStack_218;
      reader.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffde0.raw;
      reader.reader.capTable = local_210;
      reader.reader.data = pvStack_208;
      reader.reader.pointers = local_200;
      reader.reader._32_8_ = uStack_1f8;
      reader.reader._40_8_ = local_1f0;
      checkDynamicTestMessage(reader);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
      (*pCVar1->_vptr_CallContextHook[1])(pCVar1);
      local_250._vptr_Runnable = (_func_int **)&PTR_run_00608708;
      local_248 = (SegmentBuilder *)&context;
      kj::_::runCatchingExceptions(&local_198,&local_250);
      if ((Void)local_198.ptr.isSet == (Void)0x1) {
        kj::Exception::~Exception(&local_198.ptr.field_1.value);
      }
      else if (kj::_::Debug::minSeverity < 3) {
        kj::_::Debug::log<char_const(&)[88]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x199,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr\""
                   ,(char (*) [88])
                    "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr"
                  );
      }
      goto LAB_00283353;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],capnp::Text::Reader&>
            ((Fault *)&local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0x19c,UNIMPLEMENTED,(char *)0x0,"\"Method not implemented\", methodName",
             (char (*) [23])"Method not implemented",(Reader *)&local_260);
  kj::_::Debug::Fault::~Fault((Fault *)&local_198);
LAB_00283353:
  OVar6 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_198);
  PVar7.super_PromiseBase.node.ptr = OVar6.ptr;
  (this->super_Server).super_Server._vptr_Server =
       (_func_int **)CONCAT44(local_198.ptr._4_4_,local_198.ptr._0_4_);
  (this->super_Server).super_Server.thisHook =
       (ClientHook *)local_198.ptr.field_1.value.ownFile.content.ptr;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> call(InterfaceSchema::Method method,
                         CallContext<DynamicStruct, DynamicStruct> context) {
    auto methodName = method.getProto().getName();
    if (methodName == "foo") {
      ++callCount;
      auto params = context.getParams();
      EXPECT_EQ(123, params.get("i").as<int>());
      EXPECT_TRUE(params.get("j").as<bool>());
      context.getResults().set("x", "foo");
      return kj::READY_NOW;
    } else if (methodName == "baz") {
      ++callCount;
      auto params = context.getParams();
      checkDynamicTestMessage(params.get("s").as<DynamicStruct>());
      context.releaseParams();
      EXPECT_ANY_THROW(context.getParams());
      return kj::READY_NOW;
    } else {
      KJ_UNIMPLEMENTED("Method not implemented", methodName) { break; }
      return kj::READY_NOW;
    }
  }